

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * __thiscall cmTarget::GetSuffixVariableInternal(cmTarget *this,bool implib)

{
  bool bVar1;
  char *pcVar2;
  allocator local_31;
  string local_30;
  
  switch(this->TargetTypeValue) {
  case EXECUTABLE:
    if (implib) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    else if (this->IsAndroid == true) {
      std::__cxx11::string::string((string *)&local_30,"ANDROID_GUI",&local_31);
      bVar1 = GetPropertyAsBool(this,&local_30);
      pcVar2 = "CMAKE_EXECUTABLE_SUFFIX";
      if (bVar1) {
        pcVar2 = "CMAKE_SHARED_LIBRARY_SUFFIX";
      }
      std::__cxx11::string::~string((string *)&local_30);
    }
    else {
      pcVar2 = "CMAKE_EXECUTABLE_SUFFIX";
    }
    break;
  case STATIC_LIBRARY:
    pcVar2 = "CMAKE_STATIC_LIBRARY_SUFFIX";
    break;
  case SHARED_LIBRARY:
    pcVar2 = "CMAKE_SHARED_LIBRARY_SUFFIX";
    goto LAB_003a5974;
  case MODULE_LIBRARY:
    pcVar2 = "CMAKE_SHARED_MODULE_SUFFIX";
LAB_003a5974:
    if (implib) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    break;
  default:
    pcVar2 = "";
  }
  return pcVar2;
}

Assistant:

void cmTarget::SetType(cmState::TargetType type, const std::string& name)
{
  this->Name = name;
  // only add dependency information for library targets
  this->TargetTypeValue = type;
  if(this->TargetTypeValue >= cmState::STATIC_LIBRARY
     && this->TargetTypeValue <= cmState::MODULE_LIBRARY)
    {
    this->RecordDependencies = true;
    }
  else
    {
    this->RecordDependencies = false;
    }
}